

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::AsyncOutputStream,_std::nullptr_t> __thiscall
kj::HttpServer::Connection::reject
          (Connection *this,uint statusCode,StringPtr statusText,HttpHeaders *headers,
          Maybe<unsigned_long> expectedBodySize)

{
  int iVar1;
  undefined8 *puVar2;
  char (*params) [32];
  AsyncOutputStream *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar3;
  Own<kj::AsyncOutputStream,_std::nullptr_t> OVar4;
  DebugExpression<bool> _kjCondition;
  uint7 uStack_1ff;
  Array<char> local_1d8;
  Fault f;
  
  lVar3 = CONCAT44(in_register_00000034,statusCode);
  if (*(char *)(lVar3 + 0x148) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1fad,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal(&f);
  }
  iVar1 = *(int *)(lVar3 + 0x150);
  if (iVar1 == 1) {
    __kjCondition = (OwnPromiseNode)((ulong)uStack_1ff << 8);
  }
  else {
    _kjCondition.value = iVar1 == 2;
    if (iVar1 == 2) {
      _kjCondition.value = (uint)statusText.content.ptr - 300 < 0xffffff9c;
      if (!_kjCondition.value) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[43]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x1faf,FAILED,"statusCode < 200 || statusCode >= 300",
                   "_kjCondition,\"the statusCode must not be 2xx for reject.\"",&_kjCondition.value
                   ,(char (*) [43])"the statusCode must not be 2xx for reject.");
        kj::_::Debug::Fault::fatal(&f);
      }
      params = (char (*) [32])statusText.content.size_;
      Promise<kj::HttpServer::Connection::LoopResult>::Promise
                ((Promise<kj::HttpServer::Connection::LoopResult> *)&_kjCondition,BREAK_LOOP_CONN_OK
                );
      f.exception._0_1_ = 1;
      __kjCondition = (OwnPromiseNode)(PromiseNode *)0x0;
      Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
                ((Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)(lVar3 + 0x178),
                 (Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)&f);
      kj::_::NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::~NullableValue
                ((NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)&f);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
      puVar2 = *(undefined8 **)(lVar3 + 400);
      if (puVar2 != (undefined8 *)0x0) {
        kj::_::Debug::makeDescription<char_const(&)[32]>
                  ((String *)&local_1d8,(Debug *)"\"the tunnel request was rejected\"",
                   "the tunnel request was rejected",params);
        Exception::Exception
                  ((Exception *)&f,DISCONNECTED,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x1fb3,(String *)&local_1d8);
        (**(code **)*puVar2)(puVar2,(Exception *)&f);
        Exception::~Exception((Exception *)&f);
        Array<char>::~Array(&local_1d8);
        *(undefined1 *)(lVar3 + 0x164) = 1;
        send(this,statusCode,(void *)(ulong)(uint)statusText.content.ptr,
             (size_t)statusText.content.size_,(int)headers);
        OVar4.ptr = extraout_RDX;
        OVar4.disposer = (Disposer *)this;
        return OVar4;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x1fb2,FAILED,"tunnelWriteGuard != nullptr",
                 "\"the tunnel stream was not initialized\"",
                 (char (*) [38])"the tunnel stream was not initialized");
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fae,FAILED,"method.is<HttpConnectMethod>()",
             "_kjCondition,\"Only use reject() with CONNECT requests.\"",&_kjCondition,
             (char (*) [41])"Only use reject() with CONNECT requests.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Own<kj::AsyncOutputStream> reject(
      uint statusCode,
      kj::StringPtr statusText,
      const HttpHeaders& headers,
      kj::Maybe<uint64_t> expectedBodySize) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    KJ_REQUIRE(method.is<HttpConnectMethod>(), "Only use reject() with CONNECT requests.");
    KJ_REQUIRE(statusCode < 200 || statusCode >= 300, "the statusCode must not be 2xx for reject.");
    tunnelRejected = Maybe<kj::Promise<LoopResult>>(BREAK_LOOP_CONN_OK);

    auto& fulfiller = KJ_ASSERT_NONNULL(tunnelWriteGuard, "the tunnel stream was not initialized");
    fulfiller->reject(KJ_EXCEPTION(DISCONNECTED, "the tunnel request was rejected"));
    closeAfterSend = true;
    return send(statusCode, statusText, headers, expectedBodySize);
  }